

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

double __thiscall r_exec::Group::update_res(Group *this,View *v)

{
  uint16_t uVar1;
  int iVar2;
  _Mem *this_00;
  View *view;
  Group *destination;
  Code *marker;
  Mem *m;
  uint16_t i;
  float fVar3;
  float fVar4;
  double dVar5;
  
  iVar2 = (*((v->super_View).object.object)->_vptr__Object[0xe])();
  dVar5 = 0.0;
  if ((char)iVar2 == '\0') {
    dVar5 = View::update_res(v);
    fVar3 = (float)dVar5;
    iVar2 = (*(v->super_View).super__Object._vptr__Object[2])(v);
    if ((0.0 < fVar3) && ((char)iVar2 == '\0')) {
      fVar4 = get_low_res_thr(this);
      if (fVar3 < fVar4) {
        uVar1 = get_ntf_grp_count(this);
        for (i = 1; (uint16_t)(i - uVar1) != 1; i = i + 1) {
          this_00 = (_Mem *)r_code::Mem::Get();
          view = (View *)operator_new(0x100);
          destination = get_ntf_grp(this,i);
          marker = (Code *)operator_new(0x150);
          m = (Mem *)r_code::Mem::Get();
          MkLowRes::MkLowRes((MkLowRes *)marker,m,(Code *)(v->super_View).object.object);
          NotificationView::NotificationView
                    ((NotificationView *)view,(Code *)this,(Code *)destination,marker);
          _Mem::inject_notification(this_00,view,false);
        }
      }
    }
    dVar5 = (double)fVar3;
  }
  return dVar5;
}

Assistant:

double Group::update_res(View *v)
{
    if (v->object->is_invalidated()) {
        return 0;
    }

    float res = v->update_res();

    if (!v->isNotification() && res > 0 && res < get_low_res_thr()) {
        uint16_t ntf_grp_count = get_ntf_grp_count();

        for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
            _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowRes(_Mem::Get(), v->object)), false);
        }
    }

    return res;
}